

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pthread.cc
# Opt level: O3

void thread_local_destructor(void *arg)

{
  int iVar1;
  long lVar2;
  thread_local_destructor_t destructors [5];
  thread_local_destructor_t local_38 [5];
  
  if (arg != (void *)0x0) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&g_destructors_lock);
    if (iVar1 == 0) {
      local_38[4] = g_destructors[4];
      local_38[2] = g_destructors[2];
      local_38[3] = g_destructors[3];
      local_38[0] = g_destructors[0];
      local_38[1] = g_destructors[1];
      pthread_mutex_unlock((pthread_mutex_t *)&g_destructors_lock);
      lVar2 = 0;
      do {
        if (local_38[lVar2] != (thread_local_destructor_t)0x0) {
          (*local_38[lVar2])(*(void **)((long)arg + lVar2 * 8));
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 5);
      free(arg);
    }
  }
  return;
}

Assistant:

static void thread_local_destructor(void *arg) {
  if (arg == NULL) {
    return;
  }

  thread_local_destructor_t destructors[NUM_OPENSSL_THREAD_LOCALS];
  if (pthread_mutex_lock(&g_destructors_lock) != 0) {
    return;
  }
  OPENSSL_memcpy(destructors, g_destructors, sizeof(destructors));
  pthread_mutex_unlock(&g_destructors_lock);

  unsigned i;
  void **pointers = reinterpret_cast<void **>(arg);
  for (i = 0; i < NUM_OPENSSL_THREAD_LOCALS; i++) {
    if (destructors[i] != NULL) {
      destructors[i](pointers[i]);
    }
  }

  free(pointers);
}